

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-threadpool.c
# Opt level: O2

int run_test_threadpool_queue_work_simple(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  char *pcVar3;
  undefined8 uStack_10;
  
  work_req.data = &data;
  uVar2 = uv_default_loop();
  iVar1 = uv_queue_work(uVar2,&work_req,work_cb,after_work_cb);
  if (iVar1 == 0) {
    uVar2 = uv_default_loop();
    uv_run(uVar2,0);
    if (work_cb_count == 1) {
      if (after_work_cb_count == 1) {
        loop = (uv_loop_t *)uv_default_loop();
        close_loop(loop);
        uVar2 = uv_default_loop();
        iVar1 = uv_loop_close(uVar2);
        if (iVar1 == 0) {
          return 0;
        }
        pcVar3 = "0 == uv_loop_close(uv_default_loop())";
        uStack_10 = 0x39;
      }
      else {
        pcVar3 = "after_work_cb_count == 1";
        uStack_10 = 0x37;
      }
    }
    else {
      pcVar3 = "work_cb_count == 1";
      uStack_10 = 0x36;
    }
  }
  else {
    pcVar3 = "r == 0";
    uStack_10 = 0x33;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-threadpool.c"
          ,uStack_10,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(threadpool_queue_work_simple) {
  int r;

  work_req.data = &data;
  r = uv_queue_work(uv_default_loop(), &work_req, work_cb, after_work_cb);
  ASSERT(r == 0);
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(work_cb_count == 1);
  ASSERT(after_work_cb_count == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}